

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementBackgroundBorder.cpp
# Opt level: O1

Geometry * __thiscall
Rml::ElementBackgroundBorder::GetClipGeometry
          (ElementBackgroundBorder *this,Element *element,BoxArea clip_area)

{
  code *pcVar1;
  undefined1 auVar2 [8];
  float fVar3;
  bool bVar4;
  RenderManager *mesh_00;
  Background *this_00;
  Mesh mesh;
  Mesh local_88;
  undefined1 local_58 [8];
  float local_50;
  
  if (clip_area - Border < 3) {
    mesh_00 = Element::GetRenderManager(element);
    this_00 = GetOrCreateBackground(this,clip_area + Border);
    if ((mesh_00 != (RenderManager *)0x0) &&
       ((this_00->geometry).
        super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
        .resource_handle == Invalid)) {
      Geometry::Release(&local_88,&this_00->geometry,ClearMesh);
      Element::GetRenderBox((RenderBox *)local_58,element,clip_area,0);
      MeshUtilities::GenerateBackground
                (&local_88,(RenderBox *)local_58,(ColourbPremultiplied)0xffffffff);
      RenderManager::MakeGeometry((RenderManager *)local_58,(Mesh *)mesh_00);
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                          *)this_00);
      fVar3 = local_50;
      auVar2 = local_58;
      local_58._0_4_ = 0.0;
      local_58._4_4_ = 0.0;
      (this_00->geometry).
      super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      .render_manager = (RenderManager *)auVar2;
      local_50 = -NAN;
      (this_00->geometry).
      super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      .resource_handle = (StableVectorIndex)fVar3;
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                          *)local_58);
      if (local_88.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_88.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.vertices.
                        super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.vertices.
                              super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.vertices.
                              super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    bVar4 = Assert("RMLUI_ERROR",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementBackgroundBorder.cpp"
                   ,0x57);
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    this_00 = (Background *)0x0;
  }
  return &this_00->geometry;
}

Assistant:

Geometry* ElementBackgroundBorder::GetClipGeometry(Element* element, BoxArea clip_area)
{
	BackgroundType type = {};
	switch (clip_area)
	{
	case Rml::BoxArea::Border: type = BackgroundType::ClipBorder; break;
	case Rml::BoxArea::Padding: type = BackgroundType::ClipPadding; break;
	case Rml::BoxArea::Content: type = BackgroundType::ClipContent; break;
	default: RMLUI_ERROR; return nullptr;
	}

	RenderManager* render_manager = element->GetRenderManager();
	Geometry& geometry = GetOrCreateBackground(type).geometry;
	if (render_manager && !geometry)
	{
		Mesh mesh = geometry.Release(Geometry::ReleaseMode::ClearMesh);
		MeshUtilities::GenerateBackground(mesh, element->GetRenderBox(clip_area), ColourbPremultiplied(255));
		geometry = render_manager->MakeGeometry(std::move(mesh));
	}

	return &geometry;
}